

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O0

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)3>(void)

{
  vector_t<CPUType::AVX2,_int> input_00;
  ulong uVar1;
  char *__first;
  char *__last;
  longlong (*palVar2) [4];
  size_t sVar3;
  ExprLhs<const_int_&> *this;
  ExprLhs<const_int_&> rhs;
  AssertionHandler catchAssertionHandler;
  size_t i;
  qvector_t<(intgemm::CPUType)3,_int> result;
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  int LENGTH;
  ITransientExpression *expr;
  size_t in_stack_fffffffffffffca8;
  AssertionHandler *this_00;
  size_t in_stack_fffffffffffffcb0;
  StringRef *macroName;
  AlignedVector<int> *in_stack_fffffffffffffcb8;
  AssertionHandler *this_01;
  StringRef in_stack_fffffffffffffcc0;
  longlong lVar4;
  SourceLineInfo local_190;
  StringRef local_180;
  ulong local_128;
  ITransientExpression *local_120;
  AssertionHandler *pAStack_118;
  StringRef *pSStack_110;
  AssertionHandler *pAStack_108;
  longlong local_100;
  longlong lStack_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  longlong local_c0;
  longlong lStack_b8;
  longlong lStack_b0;
  longlong lStack_a8;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  AlignedVector<int> local_58;
  AlignedVector<signed_char> local_48;
  undefined4 local_34;
  
  if (2 < kCPU) {
    local_34 = 0x20;
    lVar4 = 0x20;
    AlignedVector<signed_char>::AlignedVector
              ((AlignedVector<signed_char> *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffca8);
    AlignedVector<int>::AlignedVector
              (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    __first = AlignedVector<signed_char>::begin(&local_48);
    __last = AlignedVector<signed_char>::end(&local_48);
    std::iota<signed_char*,signed_char>(__first,__last,-0x10);
    palVar2 = AlignedVector<signed_char>::as<long_long__vector(4)>(&local_48);
    expr = (ITransientExpression *)(*palVar2)[0];
    this_00 = (AssertionHandler *)(*palVar2)[1];
    macroName = (StringRef *)(*palVar2)[2];
    this_01 = (AssertionHandler *)(*palVar2)[3];
    input_00[1] = (longlong)__last;
    input_00[0] = (longlong)palVar2;
    input_00[2] = (longlong)__first;
    input_00[3] = lVar4;
    local_120 = expr;
    pAStack_118 = this_00;
    pSStack_110 = macroName;
    pAStack_108 = this_01;
    kernels::upcast8to32(input_00);
    palVar2 = AlignedVector<int>::as<long_long__vector(4)>(&local_58);
    (*palVar2)[0] = local_100;
    (*palVar2)[1] = lStack_f8;
    (*palVar2)[2] = lStack_f0;
    (*palVar2)[3] = lStack_e8;
    palVar2 = AlignedVector<int>::as<long_long__vector(4)>(&local_58);
    palVar2[1][0] = local_e0;
    palVar2[1][1] = lStack_d8;
    palVar2[1][2] = lStack_d0;
    palVar2[1][3] = lStack_c8;
    palVar2 = AlignedVector<int>::as<long_long__vector(4)>(&local_58);
    palVar2[2][0] = local_c0;
    palVar2[2][1] = lStack_b8;
    palVar2[2][2] = lStack_b0;
    palVar2[2][3] = lStack_a8;
    palVar2 = AlignedVector<int>::as<long_long__vector(4)>(&local_58);
    palVar2[3][0] = local_a0;
    palVar2[3][1] = lStack_98;
    palVar2[3][2] = lStack_90;
    palVar2[3][3] = lStack_88;
    for (local_128 = 0; uVar1 = local_128, sVar3 = AlignedVector<int>::size(&local_58),
        uVar1 < sVar3; local_128 = local_128 + 1) {
      local_180 = operator____catch_sr((char *)this_00,(size_t)expr);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
                 ,0x65);
      Catch::StringRef::StringRef((StringRef *)this_01,(char *)macroName);
      Catch::AssertionHandler::AssertionHandler
                (this_01,macroName,(SourceLineInfo *)this_00,in_stack_fffffffffffffcc0,
                 (Flags)((ulong)expr >> 0x20));
      this = (ExprLhs<const_int_&> *)AlignedVector<int>::operator[](&local_58,local_128);
      rhs = Catch::Decomposer::operator<=((Decomposer *)expr,(int *)0x28a022);
      AlignedVector<signed_char>::operator[](&local_48,local_128);
      Catch::ExprLhs<int_const&>::operator==(this,rhs.m_lhs);
      Catch::AssertionHandler::handleExpr(this_00,expr);
      Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr
                ((BinaryExpr<const_int_&,_const_int_&> *)0x28a0a4);
      Catch::AssertionHandler::complete(this_00);
      Catch::AssertionHandler::~AssertionHandler(this_00);
    }
    AlignedVector<int>::~AlignedVector((AlignedVector<int> *)0x28a1bf);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28a1cc);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}